

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphbuilderadapter.cpp
# Opt level: O2

void __thiscall
YAML::GraphBuilderAdapter::OnNull(GraphBuilderAdapter *this,Mark *mark,anchor_t anchor)

{
  void *pvVar1;
  
  pvVar1 = GetCurrentParent(this);
  pvVar1 = (void *)(**(code **)(*(long *)this->m_builder + 0x10))(this->m_builder,mark,pvVar1);
  RegisterAnchor(this,anchor,pvVar1);
  DispositionNode(this,pvVar1);
  return;
}

Assistant:

void GraphBuilderAdapter::OnNull(const Mark &mark, anchor_t anchor) {
  void *pParent = GetCurrentParent();
  void *pNode = m_builder.NewNull(mark, pParent);
  RegisterAnchor(anchor, pNode);

  DispositionNode(pNode);
}